

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_noise.c
# Opt level: O1

noise_stats_t * fe_init_noisestats(int num_filters)

{
  noise_stats_t *pnVar1;
  powspec_t *ppVar2;
  long lVar3;
  size_t n_elem;
  
  pnVar1 = (noise_stats_t *)
           __ckd_calloc__(1,0xe8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_noise.c"
                          ,0xc9);
  n_elem = (size_t)num_filters;
  ppVar2 = (powspec_t *)
           __ckd_calloc__(n_elem,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_noise.c"
                          ,0xcc);
  pnVar1->power = ppVar2;
  ppVar2 = (powspec_t *)
           __ckd_calloc__(n_elem,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_noise.c"
                          ,0xce);
  pnVar1->noise = ppVar2;
  ppVar2 = (powspec_t *)
           __ckd_calloc__(n_elem,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_noise.c"
                          ,0xd0);
  pnVar1->floor = ppVar2;
  ppVar2 = (powspec_t *)
           __ckd_calloc__(n_elem,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_noise.c"
                          ,0xd2);
  pnVar1->peak = ppVar2;
  pnVar1->undefined = 1;
  pnVar1->num_filters = num_filters;
  pnVar1->lambda_power = 0.7;
  pnVar1->comp_lambda_power = 0.30000000000000004;
  pnVar1->lambda_a = 0.995;
  pnVar1->comp_lambda_a = 0.0050000000000000044;
  pnVar1->lambda_b = 0.5;
  pnVar1->comp_lambda_b = 0.5;
  pnVar1->lambda_t = 0.85;
  pnVar1->mu_t = 0.2;
  pnVar1->max_gain = 20.0;
  pnVar1->inv_max_gain = 0.05;
  lVar3 = 0x13;
  do {
    (&pnVar1->power)[lVar3] = (powspec_t *)(1.0 / (double)((int)lVar3 + -0x12));
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x1b);
  ppVar2 = (powspec_t *)
           __ckd_calloc__(n_elem,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_noise.c"
                          ,0xf7);
  pnVar1->signal = ppVar2;
  ppVar2 = (powspec_t *)
           __ckd_calloc__(n_elem,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_noise.c"
                          ,0xf8);
  pnVar1->gain = ppVar2;
  return pnVar1;
}

Assistant:

noise_stats_t *
fe_init_noisestats(int num_filters)
{
    int i;
    noise_stats_t *noise_stats;

    noise_stats = (noise_stats_t *) ckd_calloc(1, sizeof(noise_stats_t));

    noise_stats->power =
        (powspec_t *) ckd_calloc(num_filters, sizeof(powspec_t));
    noise_stats->noise =
        (powspec_t *) ckd_calloc(num_filters, sizeof(powspec_t));
    noise_stats->floor =
        (powspec_t *) ckd_calloc(num_filters, sizeof(powspec_t));
    noise_stats->peak =
        (powspec_t *) ckd_calloc(num_filters, sizeof(powspec_t));

    noise_stats->undefined = TRUE;
    noise_stats->num_filters = num_filters;

#ifndef FIXED_POINT
    noise_stats->lambda_power = LAMBDA_POWER;
    noise_stats->comp_lambda_power = 1 - LAMBDA_POWER;
    noise_stats->lambda_a = LAMBDA_A;
    noise_stats->comp_lambda_a = 1 - LAMBDA_A;
    noise_stats->lambda_b = LAMBDA_B;
    noise_stats->comp_lambda_b = 1 - LAMBDA_B;
    noise_stats->lambda_t = LAMBDA_T;
    noise_stats->mu_t = MU_T;
    noise_stats->max_gain = MAX_GAIN;
    noise_stats->inv_max_gain = 1.0 / MAX_GAIN;
    
    for (i = 1; i < 2 * SMOOTH_WINDOW + 1; i++) {
        noise_stats->smooth_scaling[i] = 1.0 / i;
    }
#else
    noise_stats->lambda_power = FLOAT2FIX(log(LAMBDA_POWER));
    noise_stats->comp_lambda_power = FLOAT2FIX(log(1 - LAMBDA_POWER));
    noise_stats->lambda_a = FLOAT2FIX(log(LAMBDA_A));
    noise_stats->comp_lambda_a = FLOAT2FIX(log(1 - LAMBDA_A));
    noise_stats->lambda_b = FLOAT2FIX(log(LAMBDA_B));
    noise_stats->comp_lambda_b = FLOAT2FIX(log(1 - LAMBDA_B));
    noise_stats->lambda_t = FLOAT2FIX(log(LAMBDA_T));
    noise_stats->mu_t = FLOAT2FIX(log(MU_T));
    noise_stats->max_gain = FLOAT2FIX(log(MAX_GAIN));
    noise_stats->inv_max_gain = FLOAT2FIX(log(1.0 / MAX_GAIN));

    for (i = 1; i < 2 * SMOOTH_WINDOW + 3; i++) {
        noise_stats->smooth_scaling[i] = FLOAT2FIX(log(i));
    }
#endif

    noise_stats->signal = (powspec_t *) ckd_calloc(num_filters, sizeof(powspec_t));
    noise_stats->gain = (powspec_t *) ckd_calloc(num_filters, sizeof(powspec_t));

    return noise_stats;
}